

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::cpp_function::destruct(function_record *rec)

{
  function_record *pfVar1;
  pointer paVar2;
  PyObject *pPVar3;
  argument_record *arg;
  pointer paVar4;
  
  if (rec != (function_record *)0x0) {
    do {
      pfVar1 = rec->next;
      if (rec->free_data != (_func_void_function_record_ptr *)0x0) {
        (*rec->free_data)(rec);
      }
      free(rec->name);
      free(rec->doc);
      free(rec->signature);
      paVar2 = (rec->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar4 = (rec->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1
          ) {
        free(paVar4->name);
        free(paVar4->descr);
        pPVar3 = (paVar4->value).m_ptr;
        if ((pPVar3 != (PyObject *)0x0) &&
           (pPVar3->ob_refcnt = pPVar3->ob_refcnt + -1, pPVar3->ob_refcnt == 0)) {
          _Py_Dealloc();
        }
      }
      if (rec->def != (PyMethodDef *)0x0) {
        free(rec->def->ml_doc);
        if (rec->def != (PyMethodDef *)0x0) {
          operator_delete(rec->def,0x20);
        }
      }
      paVar4 = (rec->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (paVar4 != (pointer)0x0) {
        operator_delete(paVar4,(long)(rec->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)paVar4);
      }
      operator_delete(rec,0x80);
      rec = pfVar1;
    } while (pfVar1 != (function_record *)0x0);
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec) {
        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            std::free((char *) rec->name);
            std::free((char *) rec->doc);
            std::free((char *) rec->signature);
            for (auto &arg: rec->args) {
                std::free(const_cast<char *>(arg.name));
                std::free(const_cast<char *>(arg.descr));
                arg.value.dec_ref();
            }
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                delete rec->def;
            }
            delete rec;
            rec = next;
        }
    }